

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O2

MPP_RET mpp_packet_new(MppPacket *packet)

{
  undefined8 *puVar1;
  char *fmt;
  
  if (packet == (MppPacket *)0x0) {
    fmt = "invalid NULL input\n";
  }
  else {
    puVar1 = (undefined8 *)mpp_mem_pool_get_f("mpp_packet_new",mpp_packet_pool);
    *packet = puVar1;
    if (puVar1 != (undefined8 *)0x0) {
      *puVar1 = "mpp_packet";
      *(undefined4 *)((long)puVar1 + 0x5c) = 8;
      return MPP_OK;
    }
    fmt = "malloc failed\n";
  }
  _mpp_log_l(2,"mpp_packet",fmt,"mpp_packet_new");
  return MPP_ERR_NULL_PTR;
}

Assistant:

MPP_RET mpp_packet_new(MppPacket *packet)
{
    if (NULL == packet) {
        mpp_err_f("invalid NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppPacketImpl *p = (MppPacketImpl*)mpp_mem_pool_get(mpp_packet_pool);
    *packet = p;
    if (NULL == p) {
        mpp_err_f("malloc failed\n");
        return MPP_ERR_NULL_PTR;
    }
    setup_mpp_packet_name(p);
    p->segment_buf_cnt = MPP_PKT_SEG_CNT_DEFAULT;

    return MPP_OK;
}